

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O3

bool google::protobuf::internal::WireFormatLite::SkipField
               (CodedInputStream *input,uint32 tag,CodedOutputStream *output)

{
  byte bVar1;
  uint64 *puVar2;
  uint8 *puVar3;
  byte *pbVar4;
  bool bVar5;
  ulong uVar6;
  int iVar7;
  byte *pbVar8;
  uint32 uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  pair<unsigned_long,_bool> pVar13;
  string temp;
  string local_48;
  
  if (tag < 8) {
    return false;
  }
  bVar5 = false;
  switch(tag & 7) {
  case 0:
    puVar3 = input->buffer_;
    if ((puVar3 < input->buffer_end_) && (uVar6 = (ulong)(char)*puVar3, -1 < (long)uVar6)) {
      input->buffer_ = puVar3 + 1;
    }
    else {
      pVar13 = io::CodedInputStream::ReadVarint64Fallback(input);
      uVar6 = pVar13.first;
      if (((undefined1  [16])pVar13 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return false;
      }
    }
    if (output->buffer_size_ < 5) {
      io::CodedOutputStream::WriteVarint32SlowPath(output,tag);
      iVar7 = output->buffer_size_;
    }
    else {
      pbVar4 = output->buffer_;
      pbVar8 = pbVar4;
      uVar9 = tag;
      if (0x7f < tag) {
        do {
          *pbVar8 = (byte)tag | 0x80;
          uVar9 = tag >> 7;
          pbVar8 = pbVar8 + 1;
          bVar5 = 0x3fff < tag;
          tag = uVar9;
        } while (bVar5);
      }
      *pbVar8 = (byte)uVar9;
      iVar7 = ((int)pbVar8 - (int)pbVar4) + 1;
      output->buffer_ = output->buffer_ + iVar7;
      iVar7 = output->buffer_size_ - iVar7;
      output->buffer_size_ = iVar7;
    }
    if (iVar7 < 10) {
      io::CodedOutputStream::WriteVarint64SlowPath(output,uVar6);
    }
    else {
      pbVar4 = output->buffer_;
      pbVar8 = pbVar4;
      uVar10 = uVar6;
      if (0x7f < uVar6) {
        do {
          *pbVar8 = (byte)uVar10 | 0x80;
          uVar6 = uVar10 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar5 = 0x3fff < uVar10;
          uVar10 = uVar6;
        } while (bVar5);
      }
      *pbVar8 = (byte)uVar6;
      iVar7 = ((int)pbVar8 - (int)pbVar4) + 1;
      output->buffer_ = output->buffer_ + iVar7;
      output->buffer_size_ = output->buffer_size_ - iVar7;
    }
    break;
  case 1:
    puVar2 = (uint64 *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar2 < 8) {
      bVar5 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_48);
      if (!bVar5) {
        return false;
      }
    }
    else {
      local_48._M_dataplus._M_p = (pointer)*puVar2;
      input->buffer_ = (uint8 *)(puVar2 + 1);
    }
    if (output->buffer_size_ < 5) {
      io::CodedOutputStream::WriteVarint32SlowPath(output,tag);
    }
    else {
      pbVar4 = output->buffer_;
      pbVar8 = pbVar4;
      uVar9 = tag;
      if (0x7f < tag) {
        do {
          *pbVar8 = (byte)tag | 0x80;
          uVar9 = tag >> 7;
          pbVar8 = pbVar8 + 1;
          bVar5 = 0x3fff < tag;
          tag = uVar9;
        } while (bVar5);
      }
      *pbVar8 = (byte)uVar9;
      iVar7 = ((int)pbVar8 - (int)pbVar4) + 1;
      output->buffer_ = output->buffer_ + iVar7;
      output->buffer_size_ = output->buffer_size_ - iVar7;
    }
    io::CodedOutputStream::WriteLittleEndian64(output,(uint64)local_48._M_dataplus._M_p);
    break;
  case 2:
    pbVar4 = input->buffer_;
    if (pbVar4 < input->buffer_end_) {
      bVar1 = *pbVar4;
      uVar6 = (ulong)bVar1;
      uVar9 = (uint32)bVar1;
      if (-1 < (char)bVar1) {
        input->buffer_ = pbVar4 + 1;
        goto LAB_00563d49;
      }
    }
    else {
      uVar9 = 0;
    }
    uVar6 = io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
    if ((long)uVar6 < 0) {
      return false;
    }
LAB_00563d49:
    if (output->buffer_size_ < 5) {
      io::CodedOutputStream::WriteVarint32SlowPath(output,tag);
      iVar7 = output->buffer_size_;
    }
    else {
      pbVar4 = output->buffer_;
      pbVar8 = pbVar4;
      uVar9 = tag;
      if (0x7f < tag) {
        do {
          *pbVar8 = (byte)tag | 0x80;
          uVar9 = tag >> 7;
          pbVar8 = pbVar8 + 1;
          bVar5 = 0x3fff < tag;
          tag = uVar9;
        } while (bVar5);
      }
      *pbVar8 = (byte)uVar9;
      iVar7 = ((int)pbVar8 - (int)pbVar4) + 1;
      output->buffer_ = output->buffer_ + iVar7;
      iVar7 = output->buffer_size_ - iVar7;
      output->buffer_size_ = iVar7;
    }
    uVar11 = (uint)uVar6;
    if (iVar7 < 5) {
      io::CodedOutputStream::WriteVarint32SlowPath(output,uVar11);
    }
    else {
      pbVar4 = output->buffer_;
      uVar10 = uVar6 & 0xffffffff;
      pbVar8 = pbVar4;
      if (0x7f < uVar11) {
        uVar10 = uVar6 & 0xffffffff;
        do {
          uVar12 = (uint)uVar10;
          *pbVar8 = (byte)uVar10 | 0x80;
          uVar10 = uVar10 >> 7;
          pbVar8 = pbVar8 + 1;
        } while (0x3fff < uVar12);
      }
      *pbVar8 = (byte)uVar10;
      iVar7 = ((int)pbVar8 - (int)pbVar4) + 1;
      output->buffer_ = output->buffer_ + iVar7;
      output->buffer_size_ = output->buffer_size_ - iVar7;
    }
    local_48._M_string_length = 0;
    local_48.field_2._M_local_buf[0] = '\0';
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    bVar5 = io::CodedInputStream::ReadString(input,&local_48,uVar11);
    if (bVar5) {
      io::CodedOutputStream::WriteRaw
                (output,local_48._M_dataplus._M_p,(int)local_48._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return bVar5;
    }
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
    return bVar5;
  case 3:
    if (output->buffer_size_ < 5) {
      io::CodedOutputStream::WriteVarint32SlowPath(output,tag);
    }
    else {
      pbVar4 = output->buffer_;
      pbVar8 = pbVar4;
      uVar9 = tag;
      uVar11 = tag;
      if (0x7f < tag) {
        do {
          *pbVar8 = (byte)uVar11 | 0x80;
          uVar9 = uVar11 >> 7;
          pbVar8 = pbVar8 + 1;
          bVar5 = 0x3fff < uVar11;
          uVar11 = uVar9;
        } while (bVar5);
      }
      *pbVar8 = (byte)uVar9;
      iVar7 = ((int)pbVar8 - (int)pbVar4) + 1;
      output->buffer_ = output->buffer_ + iVar7;
      output->buffer_size_ = output->buffer_size_ - iVar7;
    }
    iVar7 = input->recursion_budget_;
    input->recursion_budget_ = iVar7 + -1;
    if (iVar7 < 1) {
      return false;
    }
    bVar5 = SkipMessage(input,output);
    if (!bVar5) {
      return false;
    }
    if (input->recursion_budget_ < input->recursion_limit_) {
      input->recursion_budget_ = input->recursion_budget_ + 1;
    }
    return input->last_tag_ == (tag & 0xfffffff8 | 4);
  default:
    goto switchD_00563a42_caseD_4;
  case 5:
    puVar3 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar3 < 4) {
      bVar5 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_48);
      if (!bVar5) {
        return false;
      }
    }
    else {
      local_48._M_dataplus._M_p._0_4_ = *(undefined4 *)puVar3;
      input->buffer_ = puVar3 + 4;
    }
    if (output->buffer_size_ < 5) {
      io::CodedOutputStream::WriteVarint32SlowPath(output,tag);
    }
    else {
      pbVar4 = output->buffer_;
      pbVar8 = pbVar4;
      uVar9 = tag;
      if (0x7f < tag) {
        do {
          *pbVar8 = (byte)tag | 0x80;
          uVar9 = tag >> 7;
          pbVar8 = pbVar8 + 1;
          bVar5 = 0x3fff < tag;
          tag = uVar9;
        } while (bVar5);
      }
      *pbVar8 = (byte)uVar9;
      iVar7 = ((int)pbVar8 - (int)pbVar4) + 1;
      output->buffer_ = output->buffer_ + iVar7;
      output->buffer_size_ = output->buffer_size_ - iVar7;
    }
    io::CodedOutputStream::WriteLittleEndian32(output,(uint32)local_48._M_dataplus._M_p);
  }
  bVar5 = true;
switchD_00563a42_caseD_4:
  return bVar5;
}

Assistant:

bool WireFormatLite::SkipField(
    io::CodedInputStream* input, uint32 tag, io::CodedOutputStream* output) {
  // Field number 0 is illegal.
  if (WireFormatLite::GetTagFieldNumber(tag) == 0) return false;
  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64 value;
      if (!input->ReadVarint64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64 value;
      if (!input->ReadLittleEndian64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32 length;
      if (!input->ReadVarint32(&length)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint32(length);
      // TODO(mkilavuz): Provide API to prevent extra string copying.
      string temp;
      if (!input->ReadString(&temp, length)) return false;
      output->WriteString(temp);
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      output->WriteVarint32(tag);
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input, output)) return false;
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(WireFormatLite::MakeTag(
          WireFormatLite::GetTagFieldNumber(tag),
          WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32 value;
      if (!input->ReadLittleEndian32(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian32(value);
      return true;
    }
    default: {
      return false;
    }
  }
}